

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall EPoller::~EPoller(EPoller *this)

{
  pointer peVar1;
  
  close(this->epollfd_);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->channels_)._M_h);
  peVar1 = (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1);
    return;
  }
  return;
}

Assistant:

EPoller::~EPoller() {
    close(epollfd_);
}